

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_value * mg_value_make_date_time(mg_date_time *date_time)

{
  mg_value *pmVar1;
  
  pmVar1 = (mg_value *)mg_allocator_malloc(&mg_system_allocator,0x10);
  if (pmVar1 != (mg_value *)0x0) {
    pmVar1->type = MG_VALUE_TYPE_DATE_TIME;
    (pmVar1->field_1).date_time_v = date_time;
  }
  return pmVar1;
}

Assistant:

mg_value *mg_value_make_date_time(mg_date_time *date_time) {
  mg_value *value = mg_allocator_malloc(&mg_system_allocator, sizeof(mg_value));
  if (!value) {
    return NULL;
  }
  value->type = MG_VALUE_TYPE_DATE_TIME;
  value->date_time_v = date_time;
  return value;
}